

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O0

wchar_t assertion_assert(char *file,wchar_t line,wchar_t value,char *condition,void *extra)

{
  void *extra_local;
  char *condition_local;
  wchar_t value_local;
  wchar_t line_local;
  char *file_local;
  
  assertion_count(file,line);
  if (value == L'\0') {
    failure_start(file,line,"Assertion failed: %s",condition);
    failure_finish(extra);
  }
  return value;
}

Assistant:

int
assertion_assert(const char *file, int line, int value,
    const char *condition, void *extra)
{
	assertion_count(file, line);
	if (!value) {
		failure_start(file, line, "Assertion failed: %s", condition);
		failure_finish(extra);
	}
	return (value);
}